

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server.c
# Opt level: O3

int socket_server_connect(socket_server *ss,uintptr_t opaque,char *addr,int port)

{
  size_t sVar1;
  undefined4 uVar2;
  int iVar3;
  request_package request;
  request_package local_238;
  
  sVar1 = strlen(addr);
  iVar3 = (int)sVar1;
  sVar1 = (size_t)iVar3;
  if (sVar1 - 0xe8 < 0xffffffffffffff00) {
    fprintf(_stderr,"socket-server : Invalid addr %s.\n",addr);
    uVar2 = -1;
  }
  else {
    local_238.u.open.id = reserve_id(ss);
    uVar2 = -1;
    if (-1 < local_238.u.open.id) {
      local_238.u.open.port = port;
      local_238.u.open.opaque = opaque;
      memcpy((void *)((long)&local_238.u + 0x10),addr,sVar1);
      local_238.header[sVar1 + 0x18] = '\0';
      if (-1 < iVar3) {
        send_request(ss,&local_238,'O',iVar3 + 0x18);
        uVar2 = local_238.u.open.id;
      }
    }
  }
  return uVar2;
}

Assistant:

int 
socket_server_connect(struct socket_server *ss, uintptr_t opaque, const char * addr, int port) {
	struct request_package request;
	int len = open_request(ss, &request, opaque, addr, port);
	if (len < 0)
		return -1;
	send_request(ss, &request, 'O', sizeof(request.u.open) + len);
	return request.u.open.id;
}